

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,
          NameAndDesc *nameAndDesc,SourceLineInfo *lineInfo)

{
  char *pcVar1;
  IMutableRegistryHub *pIVar2;
  undefined8 *in_RCX;
  char *in_RDX;
  SourceLineInfo *in_stack_000000a8;
  string *in_stack_000000b0;
  string *in_stack_000000b8;
  string *in_stack_000000c0;
  ITestCase *in_stack_000000c8;
  TestCase *this_00;
  allocator<char> local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [48];
  string *in_stack_fffffffffffffe78;
  string local_180 [32];
  string local_160 [32];
  undefined1 local_140 [288];
  undefined8 *local_20;
  char *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  pIVar2 = getMutableRegistryHub();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,local_18,(allocator *)&stack0xfffffffffffffe7f);
  extractClassName(in_stack_fffffffffffffe78);
  pcVar1 = (char *)*local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,pcVar1,&local_1b9);
  pcVar1 = (char *)local_20[1];
  this_00 = (TestCase *)&local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,pcVar1,(allocator *)this_00);
  makeTestCase(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
               in_stack_000000a8);
  (*pIVar2->_vptr_IMutableRegistryHub[3])(pIVar2,local_140);
  TestCase::~TestCase(this_00);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    char const* classOrQualifiedMethodName,
                                    NameAndDesc const& nameAndDesc,
                                    SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase( testCase,
                            extractClassName( classOrQualifiedMethodName ),
                            nameAndDesc.name,
                            nameAndDesc.description,
                            lineInfo ) );
    }